

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O1

FabArray<amrex::TagBox> * __thiscall
amrex::FabArray<amrex::TagBox>::operator=
          (FabArray<amrex::TagBox> *this,FabArray<amrex::TagBox> *rhs)

{
  FabFactory<amrex::TagBox> *pFVar1;
  FabFactory<amrex::TagBox> *pFVar2;
  pointer ppTVar3;
  void *pvVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  pointer ppTVar9;
  Long LVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (rhs != this) {
    clear(this);
    FabArrayBase::operator=(&this->super_FabArrayBase,&rhs->super_FabArrayBase);
    pFVar1 = (rhs->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::TagBox>_*,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::TagBox>_*,_false>._M_head_impl;
    (rhs->m_factory)._M_t.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::TagBox>_*,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::TagBox>_*,_false>._M_head_impl =
         (FabFactory<amrex::TagBox> *)0x0;
    pFVar2 = (this->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::TagBox>_*,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::TagBox>_*,_false>._M_head_impl;
    (this->m_factory)._M_t.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::TagBox>_*,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::TagBox>_*,_false>._M_head_impl = pFVar1;
    if (pFVar2 != (FabFactory<amrex::TagBox> *)0x0) {
      (*pFVar2->_vptr_FabFactory[1])();
    }
    (this->m_dallocator).m_arena = (rhs->m_dallocator).m_arena;
    this->define_function_called = rhs->define_function_called;
    ppTVar3 = (this->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppTVar9 = (rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar5 = *(undefined4 *)
             &(this->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined4 *)
             ((long)&(this->m_fabs_v).
                     super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
                     super__Vector_impl_data._M_start + 4);
    uVar7 = *(undefined4 *)
             &(this->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar8 = *(undefined4 *)
             ((long)&(this->m_fabs_v).
                     super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4);
    (this->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar9;
    (this->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined4 *)
     &(rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
      super__Vector_impl_data._M_start = uVar5;
    *(undefined4 *)
     ((long)&(rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>.
             _M_impl.super__Vector_impl_data._M_start + 4) = uVar6;
    *(undefined4 *)
     &(rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
      super__Vector_impl_data._M_finish = uVar7;
    *(undefined4 *)
     ((long)&(rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 4) = uVar8;
    (rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppTVar3;
    pvVar4 = this->m_hp_arrays;
    this->m_hp_arrays = rhs->m_hp_arrays;
    rhs->m_hp_arrays = pvVar4;
    (this->m_arrays).hp = (rhs->m_arrays).hp;
    (this->m_const_arrays).hp = (rhs->m_const_arrays).hp;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->m_tags).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->m_tags).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->m_tags).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_tags).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->m_tags).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->m_tags).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&(this->m_tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ,&rhs->m_tags);
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (rhs->m_tags).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (rhs->m_tags).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (rhs->m_tags).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (rhs->m_tags).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (rhs->m_tags).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (rhs->m_tags).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    if (rhs != this) {
      (this->shmem).alloc = (rhs->shmem).alloc;
      LVar10 = (rhs->shmem).n_points;
      (this->shmem).n_values = (rhs->shmem).n_values;
      (this->shmem).n_points = LVar10;
      (rhs->shmem).alloc = false;
    }
    rhs->define_function_called = false;
    ppTVar3 = (rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppTVar3) {
      (rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppTVar3;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&(rhs->m_tags).
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,(rhs->m_tags).
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    clear(rhs);
  }
  return this;
}

Assistant:

FabArray<FAB>&
FabArray<FAB>::operator= (FabArray<FAB>&& rhs) noexcept
{
    if (&rhs != this)
    {
        clear();

        FabArrayBase::operator=(std::move(rhs));
        m_factory = std::move(rhs.m_factory);
        m_dallocator = std::move(rhs.m_dallocator);
        define_function_called = rhs.define_function_called;
        std::swap(m_fabs_v, rhs.m_fabs_v);
#ifdef AMREX_USE_GPU
        std::swap(m_dp_arrays, rhs.m_dp_arrays);
#endif
        std::swap(m_hp_arrays, rhs.m_hp_arrays);
        m_arrays = rhs.m_arrays;
        m_const_arrays = rhs.m_const_arrays;
        std::swap(m_tags, rhs.m_tags);
        shmem = std::move(rhs.shmem);

        rhs.define_function_called = false;
        rhs.m_fabs_v.clear();
        rhs.m_tags.clear();
        rhs.clear();
    }
    return *this;
}